

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::OneHotEncoder::set_allocated_stringcategories
          (OneHotEncoder *this,StringVector *stringcategories)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  StringVector *stringcategories_local;
  OneHotEncoder *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_CategoryType(this);
  if (stringcategories != (StringVector *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&stringcategories->super_MessageLite);
    message_arena = (Arena *)stringcategories;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<CoreML::Specification::StringVector>
                              (message_arena_00,stringcategories,submessage_arena_00);
    }
    set_has_stringcategories(this);
    (this->CategoryType_).stringcategories_ = (StringVector *)message_arena;
  }
  return;
}

Assistant:

void OneHotEncoder::set_allocated_stringcategories(::CoreML::Specification::StringVector* stringcategories) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_CategoryType();
  if (stringcategories) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(stringcategories));
    if (message_arena != submessage_arena) {
      stringcategories = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, stringcategories, submessage_arena);
    }
    set_has_stringcategories();
    CategoryType_.stringcategories_ = stringcategories;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.OneHotEncoder.stringCategories)
}